

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_stepping_padding.cpp
# Opt level: O3

void test_2d_static<5ul,5ul,1ul,1ul,30ul,30ul>(void)

{
  int line;
  long lVar1;
  char *expr2;
  bool *pbVar2;
  int i;
  long lVar3;
  char cVar4;
  size_t true_idx;
  int dptr [961];
  bool *local_f70;
  bool *local_f68;
  bool *local_f60;
  bool *local_f58;
  bool *local_f50;
  bool *local_f48;
  bool *local_f40;
  bool local_f38 [3848];
  
  local_f38[0] = true;
  local_f68 = (bool *)CONCAT71(local_f68._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x26,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,local_f38,(bool *)&local_f68);
  local_f38[0] = true;
  local_f38[1] = false;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f68._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x28,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_f38,(int *)&local_f68);
  local_f38[0] = true;
  local_f38[1] = false;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f68 = (bool *)CONCAT44(local_f68._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x29,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_f38,(int *)&local_f68);
  local_f38[0] = true;
  local_f38[1] = true;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f68 = (bool *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x2b,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_f38,(unsigned_long *)&local_f68);
  local_f38[0] = true;
  local_f38[1] = true;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f68 = (bool *)0x3c1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x2c,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_f38,(unsigned_long *)&local_f68);
  local_f38[0] = true;
  local_f68 = (bool *)CONCAT71(local_f68._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x34,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,local_f38,(bool *)&local_f68);
  local_f38[0] = true;
  local_f38[1] = false;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f68 = (bool *)0x5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","StepX",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x36,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_f38,(unsigned_long *)&local_f68);
  local_f38[0] = true;
  local_f38[1] = false;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f68 = (bool *)0x5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","StepY",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x37,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_f38,(unsigned_long *)&local_f68);
  local_f38[0] = true;
  local_f38[1] = false;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f68 = (bool *)0x24;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / StepX) * (Y / StepY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x39,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_f38,(unsigned_long *)&local_f68);
  local_f38[0] = true;
  local_f38[1] = true;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f68 = (bool *)0x3c1;
  pbVar2 = local_f38;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x3a,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)pbVar2,(unsigned_long *)&local_f68);
  lVar1 = 0;
  local_f58 = (bool *)0x0;
  do {
    lVar3 = 0;
    local_f60 = pbVar2;
    do {
      local_f70 = (bool *)(lVar1 + lVar3);
      local_f68 = local_f70;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x44,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_f70,(unsigned_long *)&local_f68);
      local_f50 = local_f38 + (long)local_f68 * 4;
      local_f70 = pbVar2;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x46,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_f70,(int **)&local_f50);
      pbVar2[0] = true;
      pbVar2[1] = false;
      pbVar2[2] = false;
      pbVar2[3] = false;
      local_f70 = (bool *)CONCAT44(local_f70._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x4a,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int *)pbVar2,(int *)&local_f70);
      lVar3 = lVar3 + 1;
      pbVar2 = pbVar2 + 4;
    } while (lVar3 != 0x1e);
    local_f58 = (bool *)((long)local_f58 + 1);
    lVar1 = lVar1 + 0x1f;
    pbVar2 = local_f60 + 0x7c;
  } while (local_f58 != (bool *)0x1e);
  pbVar2 = local_f38;
  local_f60 = (bool *)0x0;
  lVar1 = 0;
  do {
    lVar3 = 0;
    local_f58 = pbVar2;
    while( true ) {
      local_f70 = (bool *)((long)local_f60 + lVar3);
      local_f68 = local_f70;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x53,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_f70,(unsigned_long *)&local_f68);
      local_f50 = local_f38 + (long)local_f68 * 4;
      local_f70 = pbVar2;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x55,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_f70,(int **)&local_f50);
      if (lVar3 == 0x1e) break;
      if (lVar1 == 0x1e) {
        pbVar2[0] = true;
        pbVar2[1] = false;
        pbVar2[2] = false;
        pbVar2[3] = false;
        local_f70 = (bool *)CONCAT44(local_f70._4_4_,0x18);
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,100,
                   "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)pbVar2,(int *)&local_f70);
      }
      lVar3 = lVar3 + 1;
      pbVar2 = pbVar2 + 4;
    }
    pbVar2[0] = true;
    pbVar2[1] = false;
    pbVar2[2] = false;
    pbVar2[3] = false;
    local_f70 = (bool *)CONCAT44(local_f70._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
               ,0x5c,
               "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
               ,(int *)pbVar2,(int *)&local_f70);
    lVar1 = lVar1 + 1;
    local_f60 = (bool *)((long)local_f60 + 0x1f);
    pbVar2 = local_f58 + 0x7c;
  } while (lVar1 != 0x1f);
  pbVar2 = local_f38;
  local_f58 = (bool *)0x0;
  local_f60 = (bool *)0x0;
  local_f48 = (bool *)0x0;
  do {
    lVar1 = 0;
    local_f40 = pbVar2;
    do {
      local_f68 = (bool *)((long)local_f58 + lVar1);
      local_f70 = (bool *)((long)local_f60 + lVar1);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x70,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_f70,(unsigned_long *)&local_f68);
      local_f50 = local_f38 + (long)local_f68 * 4;
      local_f70 = pbVar2;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x72,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_f70,(int **)&local_f50);
      pbVar2[0] = true;
      pbVar2[1] = false;
      pbVar2[2] = false;
      pbVar2[3] = false;
      local_f70 = (bool *)CONCAT44(local_f70._4_4_,0x47);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x76,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int *)pbVar2,(int *)&local_f70);
      pbVar2 = pbVar2 + 0x14;
      lVar1 = lVar1 + 5;
    } while (lVar1 != 0x1e);
    local_f48 = (bool *)((long)local_f48 + 1);
    pbVar2 = local_f40 + 0x25c;
    local_f60 = (bool *)((long)local_f60 + 0x97);
    local_f58 = (bool *)((long)local_f58 + 0x9b);
  } while (local_f48 != (bool *)0x6);
  pbVar2 = local_f38;
  local_f60 = (bool *)0x0;
  local_f58 = (bool *)0x0;
  do {
    local_f40 = (bool *)((ulong)local_f58 % 5);
    cVar4 = '\0';
    lVar1 = 0;
    local_f48 = pbVar2;
    while( true ) {
      local_f70 = (bool *)((long)local_f60 + lVar1);
      local_f68 = local_f70;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x7f,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_f70,(unsigned_long *)&local_f68);
      local_f50 = local_f38 + (long)local_f68 * 4;
      local_f70 = pbVar2;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x81,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_f70,(int **)&local_f50);
      if (lVar1 == 0x1e) break;
      if (local_f58 == (bool *)0x1e) {
        local_f70 = (bool *)CONCAT44(local_f70._4_4_,0x18);
        expr2 = "24";
        line = 0x8c;
      }
      else if ((local_f40 == (bool *)0x0) &&
              ((char)((char)(((uint)lVar1 & 0xff) / 5) * '\x05' + cVar4) == '\0')) {
        local_f70 = (bool *)CONCAT44(local_f70._4_4_,0x47);
        expr2 = "71";
        line = 0x97;
      }
      else {
        local_f70 = (bool *)CONCAT44(local_f70._4_4_,0x2a);
        expr2 = "42";
        line = 0x9c;
      }
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])",expr2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,line,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int *)pbVar2,(int *)&local_f70);
      lVar1 = lVar1 + 1;
      cVar4 = cVar4 + -1;
      pbVar2 = pbVar2 + 4;
    }
    local_f70 = (bool *)CONCAT44(local_f70._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
               ,0x86,
               "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
               ,(int *)pbVar2,(int *)&local_f70);
    local_f58 = (bool *)((long)local_f58 + 1);
    local_f60 = (bool *)((long)local_f60 + 0x1f);
    pbVar2 = local_f48 + 0x7c;
  } while (local_f58 != (bool *)0x1f);
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    static_assert(0 == (X % StepX), "X must be divisable by StepX");
    static_assert(0 == (Y % StepY), "Y must be divisable by StepY");

    layout_mapping_left<
        dimensions<X, Y>
      , dimensions<1, 1>
      , dimensions<PadX, PadY>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + PadX) * (Y + PadY));

    layout_mapping_left<
        dimensions<X / StepX, Y / StepY>
      , dimensions<StepX, StepY>
      , dimensions<PadX, PadY>
    > const sub_l{};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), StepX);
    BOOST_TEST_EQ((sub_l.stride(1)), StepY);

    BOOST_TEST_EQ((sub_l.size()), (X / StepX) * (Y / StepY));
    BOOST_TEST_EQ((sub_l.span()), (X + PadX) * (Y + PadY));

    int dptr[(X + PadX) * (Y + PadY)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            dptr[l.index(i, j)] = 24; 

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Set every (StepXth, StepYth) element to 71.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const p = l.pads();
        auto const s = sub_l.steps();
        auto const true_idx = (s[0] * i) + (sub_l[0] * s[0] + p[0]) * (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 71;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 71);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            // Real element in the strided sub-box.
            if (  (0 == (i % sub_l.steps()[0]))
               && (0 == (j % sub_l.steps()[1]))
               )
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 71);
            }
            // Real element not in the strided sub-box.
            else
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
            }
        }
    }
}